

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O2

SenderCompID * __thiscall
Application::querySenderCompID(SenderCompID *__return_storage_ptr__,Application *this)

{
  ostream *poVar1;
  string value;
  STRING local_28;
  
  local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
  local_28._M_string_length = 0;
  local_28.field_2._M_local_buf[0] = '\0';
  poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::operator<<(poVar1,"SenderCompID: ");
  std::operator>>((istream *)&std::cin,(string *)&local_28);
  FIX::SenderCompID::SenderCompID(__return_storage_ptr__,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  return __return_storage_ptr__;
}

Assistant:

FIX::SenderCompID Application::querySenderCompID() {
  std::string value;
  std::cout << std::endl << "SenderCompID: ";
  std::cin >> value;
  return FIX::SenderCompID(value);
}